

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_1::validateSortedAtomicRampAdditionValueChain
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *valueChain,deUint32 sumValue,
               int *invalidOperationNdx,deUint32 *errorDelta,deUint32 *errorExpected)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  iterator __first;
  iterator __last;
  value_type local_9c;
  int local_7c;
  int callNdx_1;
  int local_68;
  int callNdx;
  allocator<unsigned_int> local_51;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> chainDelta;
  deUint32 *errorExpected_local;
  deUint32 *errorDelta_local;
  int *invalidOperationNdx_local;
  deUint32 sumValue_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *valueChain_local;
  
  chainDelta.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = errorExpected;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(valueChain);
  std::allocator<unsigned_int>::allocator(&local_51);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,sVar2,&local_51);
  std::allocator<unsigned_int>::~allocator(&local_51);
  for (local_68 = 0;
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(valueChain),
      local_68 < (int)sVar2; local_68 = local_68 + 1) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(valueChain);
    local_9c = sumValue;
    if (local_68 + 1 != (int)sVar2) {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (valueChain,(long)(local_68 + 1));
      local_9c = *pvVar3;
    }
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (valueChain,(long)local_68);
    vVar1 = *pvVar3;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                        (long)local_68);
    *pvVar4 = local_9c - vVar1;
  }
  __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__last._M_current);
  local_7c = 0;
  do {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(valueChain);
    if ((int)sVar2 <= local_7c) {
      valueChain_local._7_1_ = true;
LAB_0216c7dd:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
      return valueChain_local._7_1_;
    }
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                        (long)local_7c);
    if (*pvVar4 != local_7c + 1U) {
      *invalidOperationNdx = local_7c;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                          (long)local_7c);
      *errorDelta = *pvVar4;
      *chainDelta.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = local_7c + 1;
      valueChain_local._7_1_ = false;
      goto LAB_0216c7dd;
    }
    local_7c = local_7c + 1;
  } while( true );
}

Assistant:

static bool validateSortedAtomicRampAdditionValueChain (const std::vector<deUint32>& valueChain, deUint32 sumValue, int& invalidOperationNdx, deUint32& errorDelta, deUint32& errorExpected)
{
	std::vector<deUint32> chainDelta(valueChain.size());

	for (int callNdx = 0; callNdx < (int)valueChain.size(); ++callNdx)
		chainDelta[callNdx] = ((callNdx + 1 == (int)valueChain.size()) ? (sumValue) : (valueChain[callNdx+1])) - valueChain[callNdx];

	// chainDelta contains now the actual additions applied to the value
	// check there exists an addition ramp form 1 to ...
	std::sort(chainDelta.begin(), chainDelta.end());

	for (int callNdx = 0; callNdx < (int)valueChain.size(); ++callNdx)
	{
		if ((int)chainDelta[callNdx] != callNdx+1)
		{
			invalidOperationNdx = callNdx;
			errorDelta = chainDelta[callNdx];
			errorExpected = callNdx+1;

			return false;
		}
	}

	return true;
}